

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitSubscriptSuffix(SyntaxDumper *this,SubscriptSuffixSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_118;
  SyntaxToken local_e0;
  SpecifierListSyntax *local_a8;
  SpecifierListSyntax *iter_1;
  SpecifierListSyntax *local_68;
  SpecifierListSyntax *iter;
  SyntaxToken local_50;
  SubscriptSuffixSyntax *local_18;
  SubscriptSuffixSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (SubscriptSuffixSyntax *)this;
  SubscriptSuffixSyntax::openBracketToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  for (local_68 = SubscriptSuffixSyntax::qualifiersAndAttributes(local_18);
      local_68 != (SpecifierListSyntax *)0x0;
      local_68 = (local_68->
                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 ).
                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(local_68->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  SubscriptSuffixSyntax::staticKeyword((SyntaxToken *)&iter_1,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,(SyntaxToken *)&iter_1,local_18);
  SyntaxToken::~SyntaxToken((SyntaxToken *)&iter_1);
  for (local_a8 = SubscriptSuffixSyntax::qualifiersAndAttributes_PostStatic(local_18);
      local_a8 != (SpecifierListSyntax *)0x0;
      local_a8 = (local_a8->
                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 ).
                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(local_a8->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  pEVar1 = SubscriptSuffixSyntax::expression(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  SubscriptSuffixSyntax::asteriskToken(&local_e0,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_e0,local_18);
  SyntaxToken::~SyntaxToken(&local_e0);
  SubscriptSuffixSyntax::closeBracketToken(&local_118,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_118,local_18);
  SyntaxToken::~SyntaxToken(&local_118);
  return Skip;
}

Assistant:

virtual Action visitSubscriptSuffix(const SubscriptSuffixSyntax* node) override
    {
        terminal(node->openBracketToken(), node);
        for (auto iter = node->qualifiersAndAttributes(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->staticKeyword(), node);
        for (auto iter = node->qualifiersAndAttributes_PostStatic(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->expression());
        terminal(node->asteriskToken(), node);
        terminal(node->closeBracketToken(), node);
        return Action::Skip;
    }